

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestTest.cpp
# Opt level: O1

void StubPlatformSpecificRunTestInASeperateProcess
               (UtestShell *shell,TestPlugin *param_2,TestResult *result)

{
  SimpleString local_90;
  TestFailure local_80;
  
  SimpleString::SimpleString(&local_90,"Failed in separate process");
  TestFailure::TestFailure(&local_80,shell,&local_90);
  (*result->_vptr_TestResult[0xd])(result,&local_80);
  TestFailure::~TestFailure(&local_80);
  SimpleString::~SimpleString(&local_90);
  return;
}

Assistant:

static void StubPlatformSpecificRunTestInASeperateProcess(UtestShell* shell, TestPlugin*, TestResult* result)
{
    result->addFailure(TestFailure(shell, "Failed in separate process"));
}